

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::FormattingScene::NamedMaterial(FormattingScene *this,string *name,FileLoc loc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *unaff_retaddr;
  string local_30 [20];
  int in_stack_ffffffffffffffe4;
  FormattingScene *in_stack_ffffffffffffffe8;
  
  indent_abi_cxx11_(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  Printf<std::__cxx11::string,std::__cxx11::string_const&>(unaff_retaddr,in_RDI,in_RSI);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void FormattingScene::NamedMaterial(const std::string &name, FileLoc loc) {
    Printf("%sNamedMaterial \"%s\"\n", indent(), name);
}